

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_delete *m)

{
  iterator iVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  order_book *this_00;
  event local_60;
  
  local_60._0_8_ = ZEXT28(m->StockLocate);
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,(key_type *)&local_60);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    this_00 = (order_book *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x10);
    order_book::remove(this_00,(char *)m->OrderReferenceNumber);
    uVar3 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar4 = (ulong)*(uint6 *)&m->field_0x5;
    uVar3 = ((uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
             (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
            uVar4 << 0x38) >> 0x10;
    *(ulong *)((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x30) = uVar3;
    make_ob_event(&local_60,(string *)this_00,uVar3,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
        operator_delete(local_60._symbol._M_dataplus._M_p,
                        local_60._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar2);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
      operator_delete(local_60._symbol._M_dataplus._M_p,
                      local_60._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_delete* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        ob.remove(m->OrderReferenceNumber);
        auto timestamp = itch50_timestamp(m->Timestamp);
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}